

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platformplugin_posix.cpp
# Opt level: O2

shared_ptr<IPlatformPlugin> CreatePlatformPlugin_Posix(shared_ptr<Options> *options)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<IPlatformPlugin> sVar2;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::PosixPlatformPlugin,_std::allocator<(anonymous_namespace)::PosixPlatformPlugin>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_30;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_30._M_alloc = &__a2;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00125c60;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__IPlatformPlugin_00125cb0;
  local_30._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::PosixPlatformPlugin,_std::allocator<(anonymous_namespace)::PosixPlatformPlugin>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_30);
  (options->super___shared_ptr<Options,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)(p_Var1 + 1);
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (options->super___shared_ptr<Options,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  sVar2.super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)options;
  return (shared_ptr<IPlatformPlugin>)
         sVar2.super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IPlatformPlugin> CreatePlatformPlugin_Posix(const std::shared_ptr<Options>& options) {
    return std::make_shared<PosixPlatformPlugin>(options);
}